

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.h
# Opt level: O3

void __thiscall
chrono::fea::ChContactTriangleXYZ::~ChContactTriangleXYZ(ChContactTriangleXYZ *this,void **vtt)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable._vptr_ChContactable = pp_Var1;
  (this->super_ChContactable_3vars<3,_3,_3>).super_ChVariableTupleCarrier_3vars<3,_3,_3>.
  _vptr_ChVariableTupleCarrier_3vars = (_func_int **)(vtable + 0x148);
  this->super_ChLoadableUV = *(ChLoadableUV *)(vtt + 3);
  *(void **)((long)&(this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable.
                    _vptr_ChContactable + (long)pp_Var1[-3]) = vtt[4];
  if (this->collision_model != (ChCollisionModel *)0x0) {
    (*this->collision_model->_vptr_ChCollisionModel[1])();
  }
  p_Var2 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  (this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable._vptr_ChContactable =
       (_func_int **)&PTR__ChContactable_00b04970;
  p_Var2 = (this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable.m_data.
           super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    return;
  }
  return;
}

Assistant:

virtual ~ChContactTriangleXYZ() { delete collision_model; }